

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> * __thiscall
cmGeneratorTarget::GetUtilityItems(cmGeneratorTarget *this)

{
  cmTarget *pcVar1;
  cmGeneratorTarget *t;
  _Base_ptr p_Var2;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_98;
  string local_88;
  cmLinkItem local_68;
  
  if (this->UtilityItemsDone == false) {
    this->UtilityItemsDone = true;
    pcVar1 = this->Target;
    for (p_Var2 = (pcVar1->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(pcVar1->Utilities)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      t = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGenerator,(string *)(p_Var2 + 1));
      if (t == (cmGeneratorTarget *)0x0) {
        std::__cxx11::string::string((string *)&local_88,(string *)(p_Var2 + 1));
        std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_a8,
                     (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
                     (p_Var2 + 2));
        cmLinkItem::cmLinkItem(&local_68,&local_88,(cmListFileBacktrace *)&local_a8);
        std::
        _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
        ::_M_insert_unique<cmLinkItem>(&(this->UtilityItems)._M_t,&local_68);
        cmLinkItem::~cmLinkItem(&local_68);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
        std::__cxx11::string::~string((string *)&local_88);
      }
      else {
        std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_98,
                     (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
                     (p_Var2 + 2));
        cmLinkItem::cmLinkItem(&local_68,t,(cmListFileBacktrace *)&local_98);
        std::
        _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
        ::_M_insert_unique<cmLinkItem>(&(this->UtilityItems)._M_t,&local_68);
        cmLinkItem::~cmLinkItem(&local_68);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
      }
    }
  }
  return &this->UtilityItems;
}

Assistant:

std::set<cmLinkItem> const& cmGeneratorTarget::GetUtilityItems() const
{
  if (!this->UtilityItemsDone) {
    this->UtilityItemsDone = true;
    std::set<BT<std::string>> const& utilities = this->GetUtilities();
    for (BT<std::string> const& i : utilities) {
      if (cmGeneratorTarget* gt =
            this->LocalGenerator->FindGeneratorTargetToUse(i.Value)) {
        this->UtilityItems.insert(cmLinkItem(gt, i.Backtrace));
      } else {
        this->UtilityItems.insert(cmLinkItem(i.Value, i.Backtrace));
      }
    }
  }
  return this->UtilityItems;
}